

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::EnumMember
          (PythonGenerator *this,EnumDef *enum_def,EnumVal *ev,string *code_ptr)

{
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_50;
  string *local_30;
  string *code;
  string *code_ptr_local;
  EnumVal *ev_local;
  EnumDef *enum_def_local;
  PythonGenerator *this_local;
  
  local_30 = code_ptr;
  code = code_ptr;
  code_ptr_local = &ev->name;
  ev_local = (EnumVal *)enum_def;
  enum_def_local = (EnumDef *)this;
  std::__cxx11::string::operator+=
            ((string *)code_ptr,(string *)(anonymous_namespace)::Indent_abi_cxx11_);
  IdlNamer::Variant_abi_cxx11_(&local_50,&this->namer_,(EnumVal *)code_ptr_local);
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::operator+=((string *)local_30," = ");
  EnumDef::ToString_abi_cxx11_(&local_a0,(EnumDef *)ev_local,(EnumVal *)code_ptr_local);
  std::operator+(&local_80,&local_a0,"\n");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void EnumMember(const EnumDef &enum_def, const EnumVal &ev,
                  std::string *code_ptr) const {
    auto &code = *code_ptr;
    code += Indent;
    code += namer_.Variant(ev);
    code += " = ";
    code += enum_def.ToString(ev) + "\n";
  }